

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall TPZMatrix<float>::Decompose_LU(TPZMatrix<float> *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  float fVar4;
  bool bVar5;
  int64_t iVar6;
  int64_t iVar7;
  TPZBaseMatrix *in_RDI;
  float a;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  int64_t j;
  int64_t i;
  int64_t k;
  int64_t min;
  float pivot;
  float nn;
  char *in_stack_00000178;
  char *in_stack_00000180;
  int64_t local_58;
  float local_3c;
  long local_38;
  long local_30;
  long local_28;
  int64_t local_20;
  float local_18;
  float local_14 [5];
  
  if ((in_RDI->fDecomposed != '\0') && (in_RDI->fDecomposed != '\x01')) {
    Error(in_stack_00000180,in_stack_00000178);
  }
  if (in_RDI->fDecomposed == '\0') {
    iVar6 = TPZBaseMatrix::Cols(in_RDI);
    iVar7 = TPZBaseMatrix::Rows(in_RDI);
    if (iVar6 < iVar7) {
      local_58 = TPZBaseMatrix::Cols(in_RDI);
    }
    else {
      local_58 = TPZBaseMatrix::Rows(in_RDI);
    }
    local_20 = local_58;
    for (local_28 = 0; local_28 < local_20; local_28 = local_28 + 1) {
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_28);
      local_18 = a;
      bVar5 = IsZero(a);
      lVar1 = local_28;
      if (bVar5) {
        Error(in_stack_00000180,in_stack_00000178);
        lVar1 = local_28;
      }
      while( true ) {
        local_30 = lVar1 + 1;
        lVar1 = local_30;
        iVar6 = TPZBaseMatrix::Rows(in_RDI);
        if (iVar6 <= lVar1) break;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_30,local_28);
        local_14[0] = extraout_XMM0_Da / local_18;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,local_30,local_28,local_14);
        local_38 = local_28;
        while( true ) {
          local_38 = local_38 + 1;
          lVar2 = local_38;
          iVar6 = TPZBaseMatrix::Cols(in_RDI);
          lVar1 = local_30;
          lVar3 = local_38;
          if (iVar6 <= lVar2) break;
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_30,local_38);
          fVar4 = local_14[0];
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_38);
          local_3c = -fVar4 * extraout_XMM0_Da_01 + extraout_XMM0_Da_00;
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,lVar1,lVar3,&local_3c);
        }
      }
    }
    in_RDI->fDecomposed = '\x01';
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LU() {
	
	if (  fDecomposed && fDecomposed != ELU)  Error( "Decompose_LU <Matrix already Decomposed with other scheme>" );
	if (fDecomposed) return 1;
	
	TVar nn, pivot;
	int64_t  min = ( Cols() < (Rows()) ) ? Cols() : Rows();
	
	for ( int64_t k = 0; k < min ; k++ ) {
		if (IsZero( pivot = GetVal(k, k))) Error( "Decompose_LU <matrix is singular>" );
		for ( int64_t i = k+1; i < Rows(); i++ ) {
			nn = GetVal( i, k ) / pivot;
			PutVal( i, k, nn );
			for ( int64_t j = k+1; j < Cols(); j++ ) PutVal(i,j,GetVal(i,j)-nn*GetVal(k,j));
		}
	}
	fDecomposed=ELU;
	return 1;
}